

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

void __thiscall Node::OutputData(Node *this,ostream *os)

{
  char cVar1;
  int iVar2;
  Node *pNVar3;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  DataWidth = 0;
  iVar2 = 0;
  if (0 < Level) {
    iVar2 = Level;
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (this->Tree[0] == (Node *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\"\"",2);
  }
  else {
    OutputDataValue(this->Tree[0],os);
  }
  pNVar3 = this->Tree[1];
  if (pNVar3 != (Node *)0x0) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
      std::ostream::put((char)os);
      std::ostream::flush();
      DataWidth = 0;
      cVar1 = (char)Level;
      if (Level < 1) {
        cVar1 = '\0';
      }
      local_50 = local_40;
      std::__cxx11::string::_M_construct((ulong)&local_50,cVar1);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (pNVar3->Tree[0] == (Node *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\"\"",2);
      }
      else {
        OutputDataValue(pNVar3->Tree[0],os);
      }
      pNVar3 = pNVar3->Tree[1];
    } while (pNVar3 != (Node *)0x0);
  }
  return;
}

Assistant:

void Node::OutputData(
	std::ostream& os	/**< Output stream */
)
{
	DataWidth = 0;
	os << Indent();

	//
	// Handle NULL values specially
	//
	if (Tree[0] == 0)
	{
		os << "\"\"";
	}
	else
	{
		Tree[0]->OutputDataValue(os);
	}

	//
	// Handle additional data statements attached to this one
	//
	Node* Loop = Tree[1];
	while (Loop != 0)
	{
		//
		// Let's start on a new line for each new
		// data statement, so we keep more of the
		// original formatting.
		//
		os << "," << std::endl;
		DataWidth = 0;
		os << Indent();

		//
		// Handle NULL values specially
		//
		if (Loop->Tree[0] == 0)
		{
			os << "\"\"";
		}
		else
		{
			Loop->Tree[0]->OutputDataValue(os);
		}
		Loop = Loop->Tree[1];
	}
}